

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

void __thiscall
Centaurus::CharClass<unsigned_char>::CharClass(CharClass<unsigned_char> *this,wchar_t ch)

{
  Range<unsigned_char> local_20;
  
  this->_vptr_CharClass = (_func_int **)&PTR__CharClass_001a74d0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20._vptr_Range = (_func_int **)&PTR__Range_001a7570;
  local_20.m_start = (uchar)ch;
  local_20.m_end = local_20.m_start + '\x01';
  std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>::
  emplace_back<Centaurus::Range<unsigned_char>>
            ((vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>
              *)&this->m_ranges,&local_20);
  return;
}

Assistant:

CharClass(wchar_t ch)
    {
        m_ranges.push_back(Range<TCHAR>::make_from_wide(ch, ch + 1));
    }